

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O3

void __thiscall
rsg::VariableWrite::VariableWrite
          (VariableWrite *this,GeneratorState *state,ConstValueRangeAccess valueRange)

{
  pointer ppVVar1;
  deRandom *rnd;
  ConstValueRangeAccess value;
  ConstValueRangeAccess value_00;
  ValueRangeAccess valueRange_00;
  undefined8 uVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  bool bVar5;
  deUint32 dVar6;
  Variable *variable;
  ValueEntry *pVVar7;
  pointer pSVar8;
  pointer pSVar9;
  Scalar *pSVar10;
  ValueEntry *val;
  pointer ppVVar11;
  Scalar *pSVar12;
  Variable **ppVVar13;
  pointer ppVVar14;
  VariableManager *pVVar15;
  int ndx;
  int iVar16;
  float fVar17;
  ValueRange infRange;
  ValueRange local_b8;
  
  (this->super_VariableAccess).m_variable = (Variable *)0x0;
  (this->super_VariableAccess).m_valueAccess.super_ConstStridedValueAccess<64>.m_type =
       (VariableType *)0x0;
  (this->super_VariableAccess).m_valueAccess.super_ConstStridedValueAccess<64>.m_value =
       (Scalar *)0x0;
  (this->super_VariableAccess).super_Expression._vptr_Expression =
       (_func_int **)&PTR__Expression_00d30c00;
  pVVar15 = state->m_varManager;
  local_b8.m_type.m_typeName._M_string_length = (size_type)valueRange.m_max;
  local_b8.m_type._0_8_ = valueRange.m_type;
  local_b8.m_type.m_typeName._M_dataplus._M_p = (pointer)valueRange.m_min;
  ppVVar11 = (pVVar15->m_entryCache).
             super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppVVar14 = ppVVar11;
  if (ppVVar11 !=
      (pVVar15->m_entryCache).
      super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      bVar5 = anon_unknown_0::IsWritableSupersetEntry::operator()
                        ((IsWritableSupersetEntry *)&local_b8,*ppVVar14);
      ppVVar11 = (pVVar15->m_entryCache).
                 super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (bVar5) break;
      ppVVar14 = ppVVar14 + 1;
    } while (ppVVar14 != ppVVar11);
    pVVar15 = state->m_varManager;
  }
  sVar4 = local_b8.m_type.m_typeName._M_string_length;
  _Var3._M_p = local_b8.m_type.m_typeName._M_dataplus._M_p;
  uVar2 = local_b8.m_type._0_8_;
  ppVVar13 = &(this->super_VariableAccess).m_variable;
  ppVVar1 = (pVVar15->m_entryCache).
            super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  bVar5 = anon_unknown_0::canAllocateVariable(state,valueRange.m_type);
  if ((!bVar5) ||
     ((ppVVar14 != ppVVar1 && (fVar17 = deRandom_getFloat(&state->m_random->m_rnd), 0.1 <= fVar17)))
     ) {
    rnd = &state->m_random->m_rnd;
    pVVar7 = (ValueEntry *)0x0;
    iVar16 = 0;
    do {
      if ((iVar16 < 1) ||
         (dVar6 = deRandom_getUint32(rnd), local_b8.m_type._0_8_ = uVar2,
         local_b8.m_type.m_typeName._M_dataplus._M_p = _Var3._M_p,
         local_b8.m_type.m_typeName._M_string_length = sVar4, dVar6 % (iVar16 + 1U) == 0)) {
        pVVar7 = *ppVVar14;
        local_b8.m_type._0_8_ = uVar2;
        local_b8.m_type.m_typeName._M_dataplus._M_p = _Var3._M_p;
        local_b8.m_type.m_typeName._M_string_length = sVar4;
      }
      do {
        ppVVar14 = ppVVar14 + 1;
        if (ppVVar14 == ppVVar11) break;
        bVar5 = anon_unknown_0::IsWritableSupersetEntry::operator()
                          ((IsWritableSupersetEntry *)&local_b8,*ppVVar14);
      } while (!bVar5);
      iVar16 = iVar16 + 1;
    } while (ppVVar14 != ppVVar1);
    variable = pVVar7->m_variable;
  }
  else {
    variable = VariableManager::allocate(state->m_varManager,valueRange.m_type);
  }
  *ppVVar13 = variable;
  pVVar7 = VariableManager::getParentValue(state->m_varManager,variable);
  if (pVVar7 == (ValueEntry *)0x0) {
    ValueRange::ValueRange(&local_b8,&(*ppVVar13)->m_type);
    pSVar8 = local_b8.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_b8.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_b8.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pSVar8 = (Scalar *)0x0;
    }
    pSVar9 = local_b8.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_b8.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_b8.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pSVar9 = (Scalar *)0x0;
    }
    valueRange_00.super_ConstValueRangeAccess.m_min = pSVar8;
    valueRange_00.super_ConstValueRangeAccess.m_type = &local_b8.m_type;
    valueRange_00.super_ConstValueRangeAccess.m_max = pSVar9;
    anon_unknown_0::setInfiniteRange(valueRange_00);
    if (local_b8.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_b8.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_b8.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
      super__Vector_impl_data._M_start = (Scalar *)0x0;
    }
    if (local_b8.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_b8.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_b8.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
      super__Vector_impl_data._M_start = (Scalar *)0x0;
    }
    value_00.m_min =
         local_b8.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
         super__Vector_impl_data._M_start;
    value_00.m_type = &local_b8.m_type;
    value_00.m_max =
         local_b8.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
         super__Vector_impl_data._M_start;
    VariableManager::setValue(state->m_varManager,*ppVVar13,value_00);
    ValueRange::~ValueRange(&local_b8);
  }
  else {
    pSVar10 = (pVVar7->m_valueRange).m_min.
              super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_start;
    pSVar12 = (pVVar7->m_valueRange).m_max.
              super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (pSVar10 ==
        (pVVar7->m_valueRange).m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pSVar10 = (Scalar *)0x0;
    }
    if (pSVar12 ==
        (pVVar7->m_valueRange).m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pSVar12 = (Scalar *)0x0;
    }
    value.m_min = pSVar10;
    value.m_type = &(pVVar7->m_valueRange).m_type;
    value.m_max = pSVar12;
    VariableManager::setValue(state->m_varManager,*ppVVar13,value);
  }
  return;
}

Assistant:

VariableWrite::VariableWrite (GeneratorState& state, ConstValueRangeAccess valueRange)
{
	DE_ASSERT(!valueRange.getType().isVoid());

	// Find variable with range that is superset of given range
	IsWritableSupersetEntry::Iterator	first	= state.getVariableManager().getBegin(IsWritableSupersetEntry(valueRange));
	IsWritableSupersetEntry::Iterator	end		= state.getVariableManager().getEnd(IsWritableSupersetEntry(valueRange));

	const float	createOnAssignWeight	= 0.1f; // Will essentially create an unused variable
	bool		createVar				= canAllocateVariable(state, valueRange.getType()) && (first == end || getWeightedBool(state.getRandom(), createOnAssignWeight));

	if (createVar)
	{
		m_variable = state.getVariableManager().allocate(valueRange.getType());
		// \note Storage will be LOCAL
	}
	else
	{
		// Choose random
		DE_ASSERT(first != end);
		const ValueEntry* entry = state.getRandom().choose<const ValueEntry*>(first, end);
		m_variable = entry->getVariable();
	}

	DE_ASSERT(m_variable);

	// Reset value range.
	const ValueEntry* parentEntry = state.getVariableManager().getParentValue(m_variable);
	if (parentEntry)
	{
		// Use parent value range.
		state.getVariableManager().setValue(m_variable, parentEntry->getValueRange());
	}
	else
	{
		// Use infinite range.
		ValueRange infRange(m_variable->getType());
		setInfiniteRange(infRange);

		state.getVariableManager().setValue(m_variable, infRange.asAccess());
	}
}